

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::BitCountCaseInstance::~BitCountCaseInstance(BitCountCaseInstance *this)

{
  BitCountCaseInstance *this_local;
  
  ~BitCountCaseInstance(this);
  operator_delete(this,0x220);
  return;
}

Assistant:

BitCountCaseInstance (Context& context, glu::ShaderType shaderType, const ShaderSpec& spec, int numValues, const char* name)
		: IntegerFunctionTestInstance	(context, shaderType, spec, numValues, name)
	{
	}